

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1-format-cpdlc-json.c
# Opt level: O2

void la_asn1_format_FANSLongitude_as_json(la_asn1_formatter_params p)

{
  char *val;
  la_vstring *in_stack_00000008;
  char *in_stack_00000010;
  
  val = la_asn1_value2enum(&asn_DEF_FANSLongitudeDirection,(p.vstr)->allocated_size);
  la_json_object_start(in_stack_00000008,in_stack_00000010);
  la_json_append_int64(in_stack_00000008,"deg",(int64_t)(p.vstr)->str);
  if ((long *)(p.vstr)->len != (long *)0x0) {
    la_json_append_double(in_stack_00000008,"min",(double)*(long *)(p.vstr)->len / 10.0);
  }
  la_json_append_string(in_stack_00000008,"dir",val);
  la_json_object_end(in_stack_00000008);
  return;
}

Assistant:

static LA_ASN1_FORMATTER_FUNC(la_asn1_format_FANSLongitude_as_json) {
	FANSLongitude_t const *lat = p.sptr;
	long const ldir = lat->longitudeDirection;
	char const *ldir_name = la_asn1_value2enum(&asn_DEF_FANSLongitudeDirection, ldir);
	la_json_object_start(p.vstr, p.label);
	la_json_append_int64(p.vstr, "deg", lat->longitudeDegrees);
	if(lat->minutesLatLon != NULL) {
		la_json_append_double(p.vstr, "min", *(long const *)(lat->minutesLatLon) / 10.0);
	}
	la_json_append_string(p.vstr, "dir", ldir_name);
	la_json_object_end(p.vstr);
}